

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

int32_t gguf_get_val_i32(gguf_context *ctx,int64_t key_id)

{
  pointer pgVar1;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  int line;
  
  if (-1 < key_id) {
    pgVar1 = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (key_id < ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pgVar1) / 0x58) {
      sVar2 = gguf_kv::get_ne(pgVar1 + key_id);
      if (sVar2 == 1) {
        piVar3 = gguf_kv::get_val<int>
                           ((ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                            super__Vector_impl_data._M_start + key_id,0);
        return *piVar3;
      }
      pcVar4 = "ctx->kv[key_id].get_ne() == 1";
      line = 0x342;
      goto LAB_0013f7ab;
    }
  }
  pcVar4 = "key_id >= 0 && key_id < gguf_get_n_kv(ctx)";
  line = 0x341;
LAB_0013f7ab:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",line,
             "GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

int32_t gguf_get_val_i32(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    GGML_ASSERT(ctx->kv[key_id].get_ne() == 1);
    return ctx->kv[key_id].get_val<int32_t>();
}